

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

int read_children(archive_read *a,file_info *parent)

{
  long lVar1;
  undefined4 uVar2;
  int64_t iVar3;
  uint64_t key;
  iso9660 *a_00;
  file_info *pfVar4;
  long in_RSI;
  archive *in_RDI;
  file_info *unaff_retaddr;
  content *con;
  file_info *child;
  int64_t skipsize;
  size_t skip_size;
  size_t step;
  file_info *multi;
  uchar *p;
  uchar *b;
  iso9660 *iso9660;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  undefined1 uVar5;
  archive_read *in_stack_ffffffffffffffa0;
  file_info *file;
  iso9660 *in_stack_ffffffffffffffd0;
  iso9660 *a_01;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar6;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(long *)(lVar1 + 0xe0) != 0) {
    __archive_read_consume
              (in_stack_ffffffffffffffa0,
               CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    *(undefined8 *)(lVar1 + 0xe0) = 0;
  }
  if (*(ulong *)(in_RSI + 0x30) < *(ulong *)(lVar1 + 0xa0)) {
    archive_set_error(in_RDI,-1,"Ignoring out-of-order directory (%s) %jd > %jd",
                      *(undefined8 *)(in_RSI + 0xa8),*(undefined8 *)(lVar1 + 0xa0),
                      *(undefined8 *)(in_RSI + 0x30));
    iVar6 = -0x14;
  }
  else if (*(ulong *)(lVar1 + 0xb0) < (ulong)(*(long *)(in_RSI + 0x30) + *(long *)(in_RSI + 0x38)))
  {
    archive_set_error(in_RDI,-1,"Directory is beyond end-of-media: %s",
                      *(undefined8 *)(in_RSI + 0xa8));
    iVar6 = -0x14;
  }
  else {
    if (*(ulong *)(lVar1 + 0xa0) < *(ulong *)(in_RSI + 0x30)) {
      iVar3 = __archive_read_consume
                        (in_stack_ffffffffffffffa0,
                         CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      if (iVar3 < 0) {
        return (int)iVar3;
      }
      *(undefined8 *)(lVar1 + 0xa0) = *(undefined8 *)(in_RSI + 0x30);
    }
    key = (((*(long *)(in_RSI + 0x38) + *(long *)(lVar1 + 0xa8)) - 1U) / *(ulong *)(lVar1 + 0xa8)) *
          *(long *)(lVar1 + 0xa8);
    a_00 = (iso9660 *)
           __archive_read_ahead
                     (in_stack_ffffffffffffffa0,
                      CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                      (ssize_t *)0x25ebc1);
    if (a_00 == (iso9660 *)0x0) {
      archive_set_error(in_RDI,-1,"Failed to read full block when scanning ISO9660 directory list");
      iVar6 = -0x1e;
    }
    else {
      *(uint64_t *)(lVar1 + 0xa0) = key + *(long *)(lVar1 + 0xa0);
      file = (file_info *)0x0;
      while (key != 0) {
        a_01 = (iso9660 *)((long)&a_00->magic + *(long *)(lVar1 + 0xa8));
        key = key - *(long *)(lVar1 + 0xa8);
        while( true ) {
          uVar5 = false;
          if ((*(char *)&a_00->magic != '\0') && (uVar5 = false, a_00 < a_01)) {
            uVar5 = (iso9660 *)((long)&a_00->magic + (long)(int)(uint)*(byte *)&a_00->magic) <= a_01
            ;
          }
          if ((bool)uVar5 == false) break;
          if ((((char)(a_00->pathname).buffer_length != '\x01') ||
              (*(char *)((long)&(a_00->pathname).buffer_length + 1) != '\0')) &&
             (((char)(a_00->pathname).buffer_length != '\x01' ||
              (*(char *)((long)&(a_00->pathname).buffer_length + 1) != '\x01')))) {
            pfVar4 = parse_file_info((archive_read *)con,unaff_retaddr,
                                     (uchar *)CONCAT44(in_stack_fffffffffffffffc,
                                                       in_stack_fffffffffffffff8));
            if (pfVar4 == (file_info *)0x0) {
              __archive_read_consume
                        (in_stack_ffffffffffffffa0,CONCAT17(uVar5,in_stack_ffffffffffffff98));
              return -0x1e;
            }
            if ((pfVar4->cl_offset == 0) &&
               ((pfVar4->multi_extent != 0 || (file != (file_info *)0x0)))) {
              if (file == (file_info *)0x0) {
                (pfVar4->contents).first = (content *)0x0;
                (pfVar4->contents).last = &(pfVar4->contents).first;
                file = pfVar4;
              }
              in_stack_ffffffffffffffa0 = (archive_read *)malloc(0x18);
              if (in_stack_ffffffffffffffa0 == (archive_read *)0x0) {
                archive_set_error(in_RDI,0xc,"No memory for multi extent");
                __archive_read_consume
                          (in_stack_ffffffffffffffa0,CONCAT17(uVar5,in_stack_ffffffffffffff98));
                return -0x1e;
              }
              uVar2 = *(undefined4 *)((long)&pfVar4->offset + 4);
              (in_stack_ffffffffffffffa0->archive).magic = *(undefined4 *)&pfVar4->offset;
              (in_stack_ffffffffffffffa0->archive).state = uVar2;
              (in_stack_ffffffffffffffa0->archive).vtable = (archive_vtable_conflict *)pfVar4->size;
              *(undefined8 *)&(in_stack_ffffffffffffffa0->archive).archive_format = 0;
              *(file->contents).last = (content *)in_stack_ffffffffffffffa0;
              (file->contents).last =
                   (content **)&(in_stack_ffffffffffffffa0->archive).archive_format;
              if (file == pfVar4) {
                iVar6 = heap_add_entry((archive_read *)a_01,(heap_queue *)a_00,file,key);
                if (iVar6 != 0) {
                  return -0x1e;
                }
              }
              else {
                file->size = pfVar4->size + file->size;
                if (pfVar4->multi_extent == 0) {
                  file = (file_info *)0x0;
                }
              }
            }
            else {
              iVar6 = heap_add_entry((archive_read *)a_01,(heap_queue *)a_00,file,key);
              if (iVar6 != 0) {
                return -0x1e;
              }
            }
          }
          a_00 = (iso9660 *)((long)&a_00->magic + (long)(int)(uint)*(byte *)&a_00->magic);
        }
        in_stack_ffffffffffffff9f = 0;
        in_stack_ffffffffffffffd0 = a_00;
        a_00 = a_01;
      }
      __archive_read_consume
                (in_stack_ffffffffffffffa0,
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
      iVar6 = read_CE((archive_read *)a_00,in_stack_ffffffffffffffd0);
      if (iVar6 == 0) {
        iVar6 = 0;
      }
      else {
        iVar6 = -0x1e;
      }
    }
  }
  return iVar6;
}

Assistant:

static int
read_children(struct archive_read *a, struct file_info *parent)
{
	struct iso9660 *iso9660;
	const unsigned char *b, *p;
	struct file_info *multi;
	size_t step, skip_size;

	iso9660 = (struct iso9660 *)(a->format->data);
	/* flush any remaining bytes from the last round to ensure
	 * we're positioned */
	if (iso9660->entry_bytes_unconsumed) {
		__archive_read_consume(a, iso9660->entry_bytes_unconsumed);
		iso9660->entry_bytes_unconsumed = 0;
	}
	if (iso9660->current_position > parent->offset) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Ignoring out-of-order directory (%s) %jd > %jd",
		    parent->name.s,
		    (intmax_t)iso9660->current_position,
		    (intmax_t)parent->offset);
		return (ARCHIVE_WARN);
	}
	if (parent->offset + parent->size > iso9660->volume_size) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Directory is beyond end-of-media: %s",
		    parent->name.s);
		return (ARCHIVE_WARN);
	}
	if (iso9660->current_position < parent->offset) {
		int64_t skipsize;

		skipsize = parent->offset - iso9660->current_position;
		skipsize = __archive_read_consume(a, skipsize);
		if (skipsize < 0)
			return ((int)skipsize);
		iso9660->current_position = parent->offset;
	}

	step = (size_t)(((parent->size + iso9660->logical_block_size -1) /
	    iso9660->logical_block_size) * iso9660->logical_block_size);
	b = __archive_read_ahead(a, step, NULL);
	if (b == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Failed to read full block when scanning "
		    "ISO9660 directory list");
		return (ARCHIVE_FATAL);
	}
	iso9660->current_position += step;
	multi = NULL;
	skip_size = step;
	while (step) {
		p = b;
		b += iso9660->logical_block_size;
		step -= iso9660->logical_block_size;
		for (; *p != 0 && p < b && p + *p <= b; p += *p) {
			struct file_info *child;

			/* N.B.: these special directory identifiers
			 * are 8 bit "values" even on a
			 * Joliet CD with UCS-2 (16bit) encoding.
			 */

			/* Skip '.' entry. */
			if (*(p + DR_name_len_offset) == 1
			    && *(p + DR_name_offset) == '\0')
				continue;
			/* Skip '..' entry. */
			if (*(p + DR_name_len_offset) == 1
			    && *(p + DR_name_offset) == '\001')
				continue;
			child = parse_file_info(a, parent, p);
			if (child == NULL) {
				__archive_read_consume(a, skip_size);
				return (ARCHIVE_FATAL);
			}
			if (child->cl_offset == 0 &&
			    (child->multi_extent || multi != NULL)) {
				struct content *con;

				if (multi == NULL) {
					multi = child;
					multi->contents.first = NULL;
					multi->contents.last =
					    &(multi->contents.first);
				}
				con = malloc(sizeof(struct content));
				if (con == NULL) {
					archive_set_error(
					    &a->archive, ENOMEM,
					    "No memory for multi extent");
					__archive_read_consume(a, skip_size);
					return (ARCHIVE_FATAL);
				}
				con->offset = child->offset;
				con->size = child->size;
				con->next = NULL;
				*multi->contents.last = con;
				multi->contents.last = &(con->next);
				if (multi == child) {
					if (add_entry(a, iso9660, child)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				} else {
					multi->size += child->size;
					if (!child->multi_extent)
						multi = NULL;
				}
			} else
				if (add_entry(a, iso9660, child) != ARCHIVE_OK)
					return (ARCHIVE_FATAL);
		}
	}

	__archive_read_consume(a, skip_size);

	/* Read data which recorded by RRIP "CE" extension. */
	if (read_CE(a, iso9660) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

	return (ARCHIVE_OK);
}